

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int av1_rc_regulate_q(AV1_COMP *cpi,int target_bits_per_frame,int active_best_quality,
                     int active_worst_quality,int width,int height)

{
  uint64_t uVar1;
  AQ_MODE AVar2;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar3;
  CYCLIC_REFRESH *pCVar4;
  RefCntBuffer *pRVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  LAYER_CONTEXT *pLVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint qindex;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int q;
  uint uVar23;
  bool bVar24;
  double dVar25;
  double qstart;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  iVar12 = av1_get_MBs(width,height);
  dVar25 = get_rate_correction_factor(cpi,width,height);
  uVar15 = 0;
  iVar14 = active_worst_quality;
  uVar19 = active_best_quality;
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    uVar15 = (uint)(cpi->cyclic_refresh->apply_cyclic_refresh != 0);
  }
  while (iVar21 = iVar14,
        iVar18 = (int)((ulong)((long)target_bits_per_frame << 9) / (ulong)(long)iVar12),
        (int)uVar19 < iVar21) {
    q = (int)(uVar19 + iVar21) >> 1;
    iVar13 = get_bits_per_mb(cpi,uVar15,dVar25,q);
    iVar14 = q;
    if (iVar18 < iVar13) {
      iVar14 = iVar21;
      uVar19 = q + 1;
    }
  }
  iVar14 = get_bits_per_mb(cpi,uVar15,dVar25,uVar19);
  iVar21 = iVar18 - iVar14;
  iVar12 = 0x7fffffff;
  if (iVar18 < iVar14) {
    iVar21 = 0x7fffffff;
  }
  if ((uVar19 != active_best_quality) && (iVar21 != 0x7fffffff)) {
    iVar12 = get_bits_per_mb(cpi,uVar15,dVar25,uVar19 - 1);
    iVar12 = iVar12 - iVar18;
  }
  if (iVar12 < iVar21) {
    uVar19 = uVar19 - 1;
  }
  if ((cpi->oxcf).rc_cfg.mode != AOM_CBR) {
    return uVar19;
  }
  if ((cpi->oxcf).pass != AOM_RC_ONE_PASS) {
    return uVar19;
  }
  pAVar3 = cpi->ppi;
  if (pAVar3->lap_enabled != 0) {
    return uVar19;
  }
  iVar14 = (cpi->rc).rc_1_frame;
  uVar15 = 0x14;
  if (((iVar14 == -1) && (1000 < (cpi->rc).frame_source_sad)) &&
     ((pAVar3->p_rc).buffer_level < (pAVar3->p_rc).optimal_buffer_level >> 1)) {
    iVar12 = (cpi->rc).frames_since_key;
    bVar10 = 4 < iVar12;
    if (4 < iVar12) {
      uVar15 = 0x78;
    }
  }
  else {
    bVar10 = false;
  }
  iVar12 = (cpi->rc).avg_frame_bandwidth;
  iVar21 = iVar12 - (cpi->rc).prev_avg_frame_bandwidth;
  iVar18 = -iVar21;
  if (0 < iVar21) {
    iVar18 = iVar21;
  }
  AVar2 = (cpi->oxcf).q_cfg.aq_mode;
  uVar22 = 4;
  uVar23 = 1;
  if ((AVar2 == '\x03') && (pCVar4 = cpi->cyclic_refresh, pCVar4->apply_cyclic_refresh != 0)) {
    if ((cpi->is_screen_content_type == 0) || (pCVar4->sb_index <= pCVar4->last_sb_index)) {
      uVar17 = (cpi->rc).q_1_frame;
      if ((int)uVar17 < 0x88) {
        uVar20 = uVar17 >> 3;
        bVar24 = SBORROW4(uVar17,8);
        iVar21 = uVar17 - 8;
        goto LAB_001e5e5a;
      }
      uVar23 = 0x10;
    }
    else {
      uVar17 = (cpi->rc).q_1_frame;
      if ((int)uVar17 < 0x120) {
        uVar20 = uVar17 >> 5;
        bVar24 = SBORROW4(uVar17,0x20);
        iVar21 = uVar17 - 0x20;
LAB_001e5e5a:
        if (bVar24 == iVar21 < 0) {
          uVar23 = uVar20;
        }
      }
      else {
        uVar23 = 8;
      }
    }
    if ((cpi->is_screen_content_type != 0) && (pAVar3->use_svc == 0)) {
      if ((pAVar3->p_rc).optimal_buffer_level < (pAVar3->p_rc).buffer_level) {
        bVar24 = uVar23 < 5;
        uVar15 = uVar22;
      }
      else {
        if (bVar10) goto LAB_001e5e96;
        bVar24 = uVar23 < 9;
        uVar15 = 8;
      }
      if (!bVar24) {
        uVar15 = uVar23;
      }
    }
  }
  else {
    uVar17 = (cpi->rc).q_1_frame;
    if (cpi->is_screen_content_type == 0) {
      if ((int)uVar17 < 0x88) {
        uVar20 = uVar17 >> 3;
        bVar24 = SBORROW4(uVar17,8);
        iVar21 = -8;
        goto LAB_001e5e3e;
      }
      uVar23 = 0x10;
    }
    else if ((int)uVar17 < 0x90) {
      uVar20 = uVar17 >> 4;
      bVar24 = SBORROW4(uVar17,0x10);
      iVar21 = -0x10;
LAB_001e5e3e:
      if (bVar24 == (int)(uVar17 + iVar21) < 0) {
        uVar23 = uVar20;
      }
    }
    else {
      uVar23 = 8;
    }
  }
LAB_001e5e96:
  if (((((cpi->sf).rt_sf.rc_faster_convergence_static == 1) &&
       ((cpi->sf).rt_sf.check_scene_detection != 0)) && ((cpi->rc).frame_source_sad == 0)) &&
     ((cpi->rc).static_since_last_scene_change != 0)) {
    lVar7 = (pAVar3->p_rc).optimal_buffer_level;
    lVar8 = (pAVar3->p_rc).buffer_level;
    if ((lVar7 >> 1 < lVar8 && AVar2 == '\x03') &&
       (4 < cpi->cyclic_refresh->counter_encode_maxq_scene_change)) {
      uVar20 = 0x20;
      if (lVar7 < lVar8) {
        uVar20 = 0x3c;
      }
      uVar15 = 0;
      if (iVar14 == 1) {
        uVar15 = (uint)(lVar8 <= lVar7) << 4 | 0xffffffe0;
      }
      uVar19 = uVar15 + uVar19;
      uVar15 = uVar22;
      if (uVar23 <= uVar20) {
        uVar23 = uVar20;
      }
    }
  }
  pRVar5 = (cpi->common).prev_frame;
  if (pRVar5 == (RefCntBuffer *)0x0) {
    bVar24 = false;
  }
  else {
    bVar24 = true;
    if (pRVar5->width == width) {
      bVar24 = pRVar5->height != height || (double)iVar12 * 0.1 < (double)iVar18;
    }
  }
  if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
      (uVar22 = (cpi->rc).frames_since_key, 1 < (int)uVar22)) &&
     ((0 < (int)uVar17 && (uVar20 = (cpi->rc).q_2_frame, 0 < (int)uVar20)))) {
    if (pAVar3->use_svc == 0) {
      if (bVar24) goto LAB_001e61f4;
    }
    else if ((cpi->svc).current_superframe <= (uint)(cpi->svc).number_temporal_layers || bVar24)
    goto LAB_001e61f4;
    if (((cpi->rc).rtc_external_ratectrl == 0) &&
       (((cpi->oxcf).rc_cfg.gf_cbr_boost_pct == 0 ||
        (((cpi->refresh_frame).alt_ref_frame == false &&
         ((cpi->refresh_frame).golden_frame == false)))))) {
      qindex = uVar19;
      if ((!bVar10 && uVar17 != uVar20) && (cpi->rc).rc_2_frame * iVar14 == -1) {
        uVar11 = uVar20;
        if (uVar17 < uVar20) {
          uVar11 = uVar17;
        }
        if (uVar20 < uVar17) {
          uVar20 = uVar17;
        }
        if ((int)uVar19 < (int)uVar20) {
          uVar20 = uVar19;
        }
        qindex = uVar20;
        if ((int)uVar19 < (int)uVar11) {
          qindex = uVar11;
        }
        if (((10 < uVar22) && (iVar14 == -1)) && ((int)qindex < (int)uVar19)) {
          qindex = (int)(qindex + uVar19) >> 1;
        }
      }
      if ((((cpi->sf).rt_sf.check_scene_detection != 0) &&
          (uVar6 = (cpi->rc).prev_avg_source_sad, 10 < uVar22 && uVar6 != 0)) &&
         ((cpi->rc).frame_source_sad != 0)) {
        uVar1 = (cpi->rc).avg_source_sad;
        auVar26._8_4_ = (int)(uVar1 >> 0x20);
        auVar26._0_8_ = uVar1;
        auVar26._12_4_ = 0x45300000;
        auVar27._8_4_ = (int)(uVar6 >> 0x20);
        auVar27._0_8_ = uVar6;
        auVar27._12_4_ = 0x45300000;
        dVar25 = ((auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 ((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) + -1.0;
        if (((0.0 <= dVar25) ||
            ((pAVar3->p_rc).buffer_level <= (pAVar3->p_rc).optimal_buffer_level >> 2)) ||
           ((int)qindex <= (cpi->rc).worst_quality >> 1)) {
          if (((int)qindex < (int)uVar17) && (0.1 < dVar25)) {
            lVar7 = (pAVar3->p_rc).optimal_buffer_level;
            lVar8 = (pAVar3->p_rc).maximum_buffer_size;
            lVar16 = lVar7 * 2;
            if (SBORROW8(lVar8,lVar16) != lVar8 + lVar7 * -2 < 0) {
              lVar16 = lVar8;
            }
            if ((pAVar3->p_rc).buffer_level < lVar16) {
              qindex = (int)(qindex * 3 + uVar17) >> 2;
            }
          }
        }
        else {
          bit_depth = ((cpi->common).seq_params)->bit_depth;
          dVar25 = tanh(dVar25 * 4.0);
          qstart = av1_convert_qindex_to_q(qindex,bit_depth);
          iVar14 = av1_compute_qdelta(&cpi->rc,qstart,(dVar25 * 0.5 + 1.0) * qstart,bit_depth);
          qindex = iVar14 + qindex;
          uVar17 = (cpi->rc).q_1_frame;
        }
      }
      if ((int)uVar23 < (int)(uVar17 - qindex)) {
        uVar19 = uVar17 - uVar23;
      }
      else {
        uVar19 = uVar17 + uVar15;
        if ((int)(qindex - uVar17) <= (int)uVar15) {
          uVar19 = qindex;
        }
      }
    }
  }
LAB_001e61f4:
  iVar14 = (cpi->svc).number_temporal_layers;
  uVar15 = uVar19;
  if ((((1 < iVar14) && ((cpi->svc).spatial_layer_id == 0 && !bVar24)) &&
      ((cpi->rc).rtc_external_ratectrl == 0)) && ((cpi->oxcf).resize_cfg.resize_mode != '\x03')) {
    iVar12 = (cpi->svc).temporal_layer_id;
    if (iVar12 < 1) {
      if (((iVar12 == 0) && (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
         (((pAVar3->p_rc).optimal_buffer_level >> 2 < (pAVar3->p_rc).buffer_level &&
          ((cpi->rc).frame_source_sad < 100000)))) {
        uVar15 = uVar19 - 4;
        if (iVar14 != 2) {
          uVar15 = uVar19 - 10;
        }
      }
    }
    else {
      pLVar9 = (cpi->svc).layer_context;
      if (((cpi->rc).avg_frame_bandwidth < (pLVar9->rc).avg_frame_bandwidth) &&
         (uVar15 = (pLVar9->p_rc).last_q[iVar14 <= (cpi->rc).frames_since_key] - 4,
         (int)uVar15 < (int)uVar19)) {
        uVar15 = uVar19;
      }
    }
  }
  if (((cpi->ppi->use_svc == 0) &&
      (pRVar5 = (cpi->common).prev_frame, pRVar5 != (RefCntBuffer *)0x0)) &&
     ((double)pRVar5->height * (double)pRVar5->width * 1.5 < (double)(height * width))) {
    uVar15 = (int)(uVar15 + active_worst_quality) >> 1;
  }
  if ((cpi->ppi->rtc_ref).bias_recovery_frame == true) {
    iVar12 = av1_svc_get_min_ref_dist(cpi);
    iVar14 = 0x14;
    if (iVar12 < 0x14) {
      iVar14 = iVar12;
    }
    uVar15 = uVar15 - iVar14;
  }
  uVar19 = (cpi->rc).worst_quality;
  uVar23 = (cpi->rc).best_quality;
  if ((int)uVar15 < (int)uVar19) {
    uVar19 = uVar15;
  }
  if ((int)uVar19 <= (int)uVar23) {
    uVar19 = uVar23;
  }
  return uVar19;
}

Assistant:

int av1_rc_regulate_q(const AV1_COMP *cpi, int target_bits_per_frame,
                      int active_best_quality, int active_worst_quality,
                      int width, int height) {
  const int MBs = av1_get_MBs(width, height);
  const double correction_factor =
      get_rate_correction_factor(cpi, width, height);
  const int target_bits_per_mb =
      (int)(((uint64_t)target_bits_per_frame << BPER_MB_NORMBITS) / MBs);

  int q =
      find_closest_qindex_by_rate(target_bits_per_mb, cpi, correction_factor,
                                  active_best_quality, active_worst_quality);
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && has_no_stats_stage(cpi))
    return adjust_q_cbr(cpi, q, active_worst_quality, width, height);

  return q;
}